

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t mtree_atol16(char **p)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long *in_RDI;
  int sign;
  int digit;
  int base;
  int64_t last_digit_limit;
  int64_t limit;
  int64_t l;
  long local_40;
  bool local_35;
  int local_34;
  uint local_30;
  long local_28;
  long local_20;
  long local_18;
  
  if (*(char *)*in_RDI == '-') {
    local_34 = -1;
    local_20 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / ZEXT816(0x10),0);
    local_28 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) % ZEXT816(0x10),0);
    *in_RDI = *in_RDI + 1;
  }
  else {
    local_34 = 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    local_20 = SUB168((auVar2 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(0x10),0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    local_28 = SUB168((auVar3 << 0x40 | ZEXT816(0x7fffffffffffffff)) % SEXT816(0x10),0);
  }
  local_18 = 0;
  local_30 = parsehex(*(char *)*in_RDI);
  while( true ) {
    local_35 = 0xf < local_30;
    if (local_35) {
      if (local_34 < 0) {
        local_40 = -local_18;
      }
      else {
        local_40 = local_18;
      }
      return local_40;
    }
    if ((local_20 < local_18) || ((local_18 == local_20 && (local_28 < (int)local_30)))) break;
    local_18 = local_18 * 0x10 + (long)(int)local_30;
    lVar1 = *in_RDI;
    *in_RDI = lVar1 + 1;
    local_30 = parsehex(*(char *)(lVar1 + 1));
  }
  if (-1 < local_34) {
    return 0x7fffffffffffffff;
  }
  return -0x8000000000000000;
}

Assistant:

static int64_t
mtree_atol16(char **p)
{
	int64_t l, limit, last_digit_limit;
	int base, digit, sign;

	base = 16;

	if (**p == '-') {
		sign = -1;
		limit = ((uint64_t)(INT64_MAX) + 1) / base;
		last_digit_limit = ((uint64_t)(INT64_MAX) + 1) % base;
		++(*p);
	} else {
		sign = 1;
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;
	}

	l = 0;
	digit = parsehex(**p);
	while (digit >= 0 && digit < base) {
		if (l > limit || (l == limit && digit > last_digit_limit))
			return (sign < 0) ? INT64_MIN : INT64_MAX;
		l = (l * base) + digit;
		digit = parsehex(*++(*p));
	}
	return (sign < 0) ? -l : l;
}